

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::reject<QString>
          (PromiseDataBase<int,_void_(const_int_&)> *this,QString *error)

{
  exception_ptr eVar1;
  void *__tmp;
  exception_ptr local_20;
  void *local_18;
  
  PromiseError::PromiseError<QString>((PromiseError *)&local_20,error);
  eVar1._M_exception_object = local_20._M_exception_object;
  local_20._M_exception_object = (void *)0x0;
  local_18 = (this->m_error).m_data._M_exception_object;
  (this->m_error).m_data._M_exception_object = eVar1._M_exception_object;
  if (local_18 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_20._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }